

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O0

void cram_index_free(cram_fd *fd)

{
  int local_14;
  int i;
  cram_fd *fd_local;
  
  if (fd->index != (cram_index *)0x0) {
    for (local_14 = 0; local_14 < fd->index_sz; local_14 = local_14 + 1) {
      cram_index_free_recurse(fd->index + local_14);
    }
    free(fd->index);
    fd->index = (cram_index *)0x0;
  }
  return;
}

Assistant:

void cram_index_free(cram_fd *fd) {
    int i;

    if (!fd->index)
	return;
    
    for (i = 0; i < fd->index_sz; i++) {
	cram_index_free_recurse(&fd->index[i]);
    }
    free(fd->index);

    fd->index = NULL;
}